

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O2

void Abc_NtkGetSeqPoSupp(Abc_Ntk_t *pNtk,int iFrame,int iNumPo)

{
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar1;
  void *pvVar2;
  Abc_Obj_t *pAVar3;
  int iVar4;
  int iVar5;
  Abc_Obj_t *pNodePo;
  
  pNtk_00 = Abc_NtkFrames(pNtk,iFrame + 1,0,0);
  pNodePo = Abc_NtkPo(pNtk_00,pNtk->vPos->nSize * iFrame + iNumPo);
  p = Abc_NtkNodeSupport(pNtk_00,&pNodePo,1);
  for (iVar4 = 0; iVar4 < pNtk_00->vCis->nSize; iVar4 = iVar4 + 1) {
    pAVar1 = Abc_NtkCi(pNtk_00,iVar4);
    (pAVar1->field_6).pTemp = (void *)0x0;
  }
  for (iVar4 = 0; iVar4 < p->nSize; iVar4 = iVar4 + 1) {
    pvVar2 = Vec_PtrEntry(p,iVar4);
    *(undefined8 *)((long)pvVar2 + 0x40) = 1;
  }
  for (iVar4 = 0; iVar4 < pNtk->vCis->nSize; iVar4 = iVar4 + 1) {
    pAVar1 = Abc_NtkCi(pNtk,iVar4);
    (pAVar1->field_6).pTemp = (void *)0x0;
  }
  for (iVar4 = 0; iVar4 < pNtk->vBoxes->nSize; iVar4 = iVar4 + 1) {
    pAVar1 = Abc_NtkBox(pNtk,iVar4);
    if ((*(uint *)&pAVar1->field_0x14 & 0xf) == 8) {
      pAVar3 = Abc_NtkBox(pNtk_00,iVar4);
      if ((pAVar3->field_6).pTemp != (void *)0x0) {
        pAVar1->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0x1;
      }
    }
  }
  for (iVar4 = 0; iVar4 < pNtk->vPis->nSize; iVar4 = iVar4 + 1) {
    pAVar1 = Abc_NtkPi(pNtk,iVar4);
    for (iVar5 = 0; iVar5 <= iFrame; iVar5 = iVar5 + 1) {
      pAVar3 = Abc_NtkPi(pNtk_00,pNtk->vPis->nSize * iVar5 + iVar4);
      if ((pAVar3->field_6).pTemp != (void *)0x0) {
        pAVar1->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0x1;
      }
    }
  }
  Vec_PtrFree(p);
  Abc_NtkDelete(pNtk_00);
  return;
}

Assistant:

void Abc_NtkGetSeqPoSupp( Abc_Ntk_t * pNtk, int iFrame, int iNumPo )
{
    Abc_Ntk_t * pFrames;
    Abc_Obj_t * pObj, * pNodePo;
    Vec_Ptr_t * vSupp;
    int i, k;
    // get the timeframes of the network
    pFrames = Abc_NtkFrames( pNtk, iFrame + 1, 0, 0 );
//Abc_NtkShowAig( pFrames );

    // get the PO of the timeframes
    pNodePo = Abc_NtkPo( pFrames, iFrame * Abc_NtkPoNum(pNtk) + iNumPo );
    // set the support
    vSupp   = Abc_NtkNodeSupport( pFrames, &pNodePo, 1 );
    // mark the support of the frames
    Abc_NtkForEachCi( pFrames, pObj, i )
        pObj->pCopy = NULL;
    Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)1;
    // mark the support of the network if the support of the timeframes is marked
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy = NULL;
    Abc_NtkForEachLatch( pNtk, pObj, i )
        if ( Abc_NtkBox(pFrames, i)->pCopy )
            pObj->pCopy = (Abc_Obj_t *)1;
    Abc_NtkForEachPi( pNtk, pObj, i )
        for ( k = 0; k <= iFrame; k++ )
            if ( Abc_NtkPi(pFrames, k*Abc_NtkPiNum(pNtk) + i)->pCopy )
                pObj->pCopy = (Abc_Obj_t *)1;
    // free stuff
    Vec_PtrFree( vSupp );
    Abc_NtkDelete( pFrames );
}